

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Node * prvTidyParseHTML(TidyDocImpl *doc,Node *html,GetTokenMode mode)

{
  int iVar1;
  TidyParserMemory *pTVar2;
  Dict *pDVar3;
  Node *pNVar4;
  Bool BVar5;
  long lVar6;
  Node *node;
  Node *pNVar7;
  Node *pNVar8;
  Node **ppNVar9;
  uint uVar10;
  TidyParserMemory memory;
  Node *local_78;
  code *local_68;
  Node *local_58;
  undefined8 uStack_50;
  
  uVar10 = 0;
  prvTidySetOptionBool(doc,TidyXmlTags,no);
  if (html == (Node *)0x0) {
    iVar1 = (doc->stack).top;
    lVar6 = (long)iVar1;
    if (lVar6 < 0) {
      html = (Node *)0x0;
      mode = IgnoreWhitespace;
      node = (Node *)0x0;
      uVar10 = 0;
    }
    else {
      pTVar2 = (doc->stack).content;
      html = pTVar2[lVar6].original_node;
      node = pTVar2[lVar6].reentry_node;
      mode = pTVar2[lVar6].reentry_mode;
      uVar10 = pTVar2[lVar6].reentry_state;
      (doc->stack).top = iVar1 + -1;
    }
  }
  else {
    node = (Node *)0x0;
  }
  if (uVar10 != 1) {
    pNVar8 = (Node *)0x0;
    local_78 = (Node *)0x0;
    do {
      if ((uVar10 & 0xfffffffd) == 0) {
        node = prvTidyGetToken(doc,IgnoreWhitespace);
      }
      pNVar7 = node;
      pNVar4 = local_78;
      switch(uVar10) {
      case 0:
        if (node == (Node *)0x0) {
LAB_0013cc4d:
          node = prvTidyInferredTag(doc,TidyTag_HEAD);
        }
        else {
          pDVar3 = node->tag;
          if ((pDVar3 == (Dict *)0x0) || (pDVar3->id != TidyTag_HEAD)) {
            if (((html != (Node *)0x0) && (pDVar3 == html->tag)) &&
               ((node->type == EndTag || ((pDVar3 == html->tag && (node->type == StartTag))))))
            goto LAB_0013ccbb;
            BVar5 = InsertMisc(html,node);
            if (BVar5 != no) break;
            prvTidyUngetToken(doc);
            goto LAB_0013cc4d;
          }
        }
        uVar10 = 4;
        break;
      default:
        uVar10 = 1;
        break;
      case 2:
        if (node == (Node *)0x0) {
          if (local_78 == (Node *)0x0) {
            node = prvTidyInferredTag(doc,TidyTag_BODY);
            uVar10 = 3;
          }
          else {
            uVar10 = 1;
            node = (Node *)0x0;
          }
        }
        else if (node->tag == html->tag) {
          if (local_78 == (Node *)0x0 && node->type != StartTag) goto LAB_0013ccbb;
LAB_0013ccca:
          prvTidyFreeNode(doc,node);
        }
        else {
          BVar5 = InsertMisc(html,node);
          if (BVar5 == no) {
            pDVar3 = node->tag;
            if (pDVar3 == (Dict *)0x0) {
LAB_0013cdab:
              BVar5 = prvTidynodeIsElement(node);
              if (BVar5 != no) {
                pDVar3 = node->tag;
                if ((pDVar3 != (Dict *)0x0) && ((pDVar3->model & 4) != 0)) {
                  MoveToHead(doc,html,node);
                  break;
                }
                if ((local_78 != (Node *)0x0 && pDVar3 != (Dict *)0x0) &&
                   (pDVar3->id == TidyTag_FRAME)) {
LAB_0013ccbb:
                  prvTidyReport(doc,html,node,0x235);
                  goto LAB_0013ccca;
                }
              }
              prvTidyUngetToken(doc);
              if (local_78 == (Node *)0x0) {
                node = prvTidyInferredTag(doc,TidyTag_BODY);
                if (*(int *)((doc->config).value + 6) != 1) {
                  prvTidyReport(doc,html,node,0x247);
                }
                prvTidyConstrainVersion(doc,0xfffffb6f);
LAB_0013ce6c:
                uVar10 = 3;
                local_78 = (Node *)0x0;
                pNVar4 = local_78;
              }
              else {
                if (pNVar8 == (Node *)0x0) {
                  pNVar8 = prvTidyInferredTag(doc,TidyTag_NOFRAMES);
                  pNVar8->parent = local_78;
                  pNVar7 = local_78->last;
                  pNVar8->prev = pNVar7;
                  ppNVar9 = &pNVar7->next;
                  if (pNVar7 == (Node *)0x0) {
                    ppNVar9 = &local_78->content;
                  }
                  *ppNVar9 = pNVar8;
                  local_78->last = pNVar8;
                }
                else {
                  prvTidyReport(doc,html,node,0x267);
                  if (pNVar8->type == StartEndTag) {
                    pNVar8->type = StartTag;
                  }
                }
                prvTidyConstrainVersion(doc,0x490);
LAB_0013ced5:
                uVar10 = 6;
              }
            }
            else {
              if (pDVar3->id != TidyTag_BODY) {
                if (pDVar3 == (Dict *)0x0) goto LAB_0013cdab;
                if (pDVar3->id == TidyTag_FRAMESET) {
                  if (node->type == StartTag) {
                    uVar10 = 8;
                    pNVar4 = node;
                    if (local_78 != (Node *)0x0) {
                      prvTidyReport(doc,html,node,0x237);
                      pNVar4 = local_78;
                    }
                    break;
                  }
                  goto LAB_0013ccbb;
                }
                if ((pDVar3 == (Dict *)0x0) || (pDVar3->id != TidyTag_NOFRAMES)) goto LAB_0013cdab;
                if (node->type != StartTag) goto LAB_0013ccbb;
                if (local_78 != (Node *)0x0) {
                  if (pNVar8 != (Node *)0x0) goto LAB_0013ccca;
                  node->parent = local_78;
                  pNVar8 = local_78->last;
                  node->prev = pNVar8;
                  ppNVar9 = &pNVar8->next;
                  if (pNVar8 == (Node *)0x0) {
                    ppNVar9 = &local_78->content;
                  }
                  *ppNVar9 = node;
                  local_78->last = node;
                  uVar10 = 6;
                  pNVar8 = node;
                  break;
                }
                prvTidyReport(doc,html,node,0x235);
                prvTidyFreeNode(doc,node);
                node = prvTidyInferredTag(doc,TidyTag_BODY);
                goto LAB_0013ce6c;
              }
              if (node->type != StartTag) goto LAB_0013ccbb;
              if (((doc->config).value[1].v == 0) && (local_78 != (Node *)0x0)) {
                prvTidyUngetToken(doc);
                if (pNVar8 == (Node *)0x0) {
                  pNVar8 = prvTidyInferredTag(doc,TidyTag_NOFRAMES);
                  pNVar8->parent = local_78;
                  pNVar7 = local_78->last;
                  pNVar8->prev = pNVar7;
                  ppNVar9 = &pNVar7->next;
                  if (pNVar7 == (Node *)0x0) {
                    ppNVar9 = &local_78->content;
                  }
                  *ppNVar9 = pNVar8;
                  local_78->last = pNVar8;
                  prvTidyReport(doc,html,pNVar8,0x247);
                  goto LAB_0013ced5;
                }
                uVar10 = 6;
                if (pNVar8->type == StartEndTag) {
                  pNVar8->type = StartTag;
                }
              }
              else {
                prvTidyConstrainVersion(doc,0xfffffb6f);
                uVar10 = 3;
              }
            }
          }
        }
        break;
      case 3:
        local_68 = (code *)0x0;
        local_58 = (Node *)0x0;
        uStack_50 = CONCAT44(1,mode);
        goto LAB_0013d0c5;
      case 4:
        local_68 = prvTidyParseHTML;
        uStack_50 = CONCAT44(5,mode);
        local_58 = node;
        goto LAB_0013d0c5;
      case 5:
        goto LAB_0013cc09;
      case 6:
        uStack_50 = CONCAT44(7,mode);
        prvTidypushMemory(doc,(TidyParserMemory)
                              ZEXT3648(CONCAT432(mode,CONCAT824(uStack_50,
                                                                CONCAT816(local_78,CONCAT88(html,
                                                  prvTidyParseHTML))))));
        return pNVar8;
      case 7:
        local_78 = node;
        goto LAB_0013cc09;
      case 8:
        local_68 = prvTidyParseHTML;
        local_58 = local_78;
        uStack_50 = CONCAT44(9,mode);
LAB_0013d0c5:
        node->parent = html;
        if (html == (Node *)0x0) {
          node->prev = (Node *)0x0;
LAB_0013d0eb:
          if (html == (Node *)0x0) goto LAB_0013d100;
          ppNVar9 = &html->content;
        }
        else {
          pNVar8 = html->last;
          node->prev = pNVar8;
          if (pNVar8 == (Node *)0x0) goto LAB_0013d0eb;
          ppNVar9 = &pNVar8->next;
        }
        *ppNVar9 = node;
        if (html != (Node *)0x0) {
          html->last = node;
        }
LAB_0013d100:
        prvTidypushMemory(doc,(TidyParserMemory)
                              ZEXT3648(CONCAT432(mode,CONCAT824(uStack_50,
                                                                CONCAT816(local_58,CONCAT88(html,
                                                  local_68))))));
        return node;
      case 9:
        for (pNVar7 = node->content; pNVar7 != (Node *)0x0; pNVar7 = pNVar7->next) {
          if ((pNVar7->tag != (Dict *)0x0) && (pNVar7->tag->id == TidyTag_NOFRAMES)) {
            pNVar8 = pNVar7;
          }
        }
        pNVar7 = (Node *)0x0;
        local_78 = node;
LAB_0013cc09:
        node = pNVar7;
        uVar10 = 2;
        pNVar4 = local_78;
      }
      local_78 = pNVar4;
    } while (uVar10 != 1);
  }
  return (Node *)0x0;
}

Assistant:

Node* TY_(ParseHTML)( TidyDocImpl *doc, Node *html, GetTokenMode mode )
{
    Node *node = NULL;
    Node *head = NULL;
    Node *frameset = NULL;
    Node *noframes = NULL;
    DEBUG_LOG_COUNTERS;

    enum parserState {
        STATE_INITIAL,                /* This is the initial state for every parser. */
        STATE_COMPLETE,               /* Complete! */
        STATE_PRE_BODY,               /* In this state, we'll consider frames vs. body. */
        STATE_PARSE_BODY,             /* In this state, we can parse the body. */
        STATE_PARSE_HEAD,             /* In this state, we will setup head for parsing. */
        STATE_PARSE_HEAD_REENTER,     /* Resume here after parsing head. */
        STATE_PARSE_NOFRAMES,         /* In this state, we can parse noframes content. */
        STATE_PARSE_NOFRAMES_REENTER, /* In this state, we can restore more state. */
        STATE_PARSE_FRAMESET,         /* In this state, we will parse frameset content. */
        STATE_PARSE_FRAMESET_REENTER, /* We need to cleanup some things after parsing frameset. */
    } state = STATE_INITIAL;

    TY_(SetOptionBool)( doc, TidyXmlTags, no );

    if ( html == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node;
        DEBUG_LOG_REENTER_WITH_NODE(node);
        html = memory.original_node;
        state = memory.reentry_state;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.reentry_mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(html);
    }

    /*
     This main loop pulls tokens from the lexer until we're out of tokens,
     or until there's no more work to do.
     */
    while ( state != STATE_COMPLETE )
    {
        if ( state == STATE_INITIAL || state == STATE_PRE_BODY )
        {
            node = TY_(GetToken)( doc, IgnoreWhitespace );
            DEBUG_LOG_GOT_TOKEN(node);
        }

        switch ( state )
        {
            /**************************************************************
             This case is all about finding a head tag and dealing with
             cases were we don't, so that we can move on to parsing a head
             tag.
             **************************************************************/
            case STATE_INITIAL:
            {
                /*
                 The only way we can possibly be here is if the lexer
                 had nothing to give us. Thus we'll create our own
                 head, and set the signal to start parsing it.
                 */
                if (node == NULL)
                {
                    node = TY_(InferredTag)(doc, TidyTag_HEAD);
                    state = STATE_PARSE_HEAD;
                    continue;
                }

                /* We found exactly what we expected: head. */
                if ( nodeIsHEAD(node) )
                {
                    state = STATE_PARSE_HEAD;
                    continue;
                }

                /* We did not expect to find an html closing tag here! */
                if (html && (node->tag == html->tag) && (node->type == EndTag))
                {
                    TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* Find and discard multiple <html> elements. */
                if (html && (node->tag == html->tag) && (node->type == StartTag))
                {
                    TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)(doc, node);
                    continue;
                }

                /* Deal with comments, etc. */
                if (InsertMisc(html, node))
                    continue;

                /*
                 At this point, we didn't find a head tag, so put the
                 token back and create our own head tag, so we can
                 move on.
                 */
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_HEAD);
                state = STATE_PARSE_HEAD;
                continue;
            } break;


            /**************************************************************
             This case determines whether we're dealing with body or
             frameset + noframes, and sets things up accordingly.
             **************************************************************/
            case STATE_PRE_BODY:
            {
                if (node == NULL )
                {
                    if (frameset == NULL) /* Implied body. */
                    {
                        node = TY_(InferredTag)(doc, TidyTag_BODY);
                        state = STATE_PARSE_BODY;
                    } else {
                        state = STATE_COMPLETE;
                    }

                    continue;
                }

                /* Robustly handle html tags. */
                if (node->tag == html->tag)
                {
                    if (node->type != StartTag && frameset == NULL)
                        TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);

                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* Deal with comments, etc. */
                if (InsertMisc(html, node))
                    continue;

                /* If frameset document, coerce <body> to <noframes> */
                if ( nodeIsBODY(node) )
                {
                    if (node->type != StartTag)
                    {
                        TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }

                    if ( cfg(doc, TidyAccessibilityCheckLevel) == 0 )
                    {
                        if (frameset != NULL)
                        {
                            TY_(UngetToken)( doc );

                            if (noframes == NULL)
                            {
                                noframes = TY_(InferredTag)(doc, TidyTag_NOFRAMES);
                                TY_(InsertNodeAtEnd)(frameset, noframes);
                                TY_(Report)(doc, html, noframes, INSERTING_TAG);
                            }
                            else
                            {
                                if (noframes->type == StartEndTag)
                                    noframes->type = StartTag;
                            }

                            state = STATE_PARSE_NOFRAMES;
                            continue;
                        }
                    }

                    TY_(ConstrainVersion)(doc, ~VERS_FRAMESET);
                    state = STATE_PARSE_BODY;
                    continue;
                }

                /* Flag an error if we see more than one frameset. */
                if ( nodeIsFRAMESET(node) )
                {
                    if (node->type != StartTag)
                    {
                        TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }

                    if (frameset != NULL)
                        TY_(Report)(doc, html, node, DUPLICATE_FRAMESET);
                    else
                        frameset = node;

                    state = STATE_PARSE_FRAMESET;
                    continue;
                }

                /* If not a frameset document coerce <noframes> to <body>. */
                if ( nodeIsNOFRAMES(node) )
                {
                    if (node->type != StartTag)
                    {
                        TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }

                    if (frameset == NULL)
                    {
                        TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        node = TY_(InferredTag)(doc, TidyTag_BODY);
                        state = STATE_PARSE_BODY;
                        continue;
                    }

                    if (noframes == NULL)
                    {
                        noframes = node;
                        TY_(InsertNodeAtEnd)(frameset, noframes);
                        state = STATE_PARSE_NOFRAMES;
                    }
                    else
                    {
                        TY_(FreeNode)( doc, node);
                    }

                    continue;
                }

                /* Deal with some other element that we're not expecting. */
                if (TY_(nodeIsElement)(node))
                {
                    if (node->tag && node->tag->model & CM_HEAD)
                    {
                        MoveToHead(doc, html, node);
                        continue;
                    }

                    /* Discard illegal frame element following a frameset. */
                    if ( frameset != NULL && nodeIsFRAME(node) )
                    {
                        TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)(doc, node);
                        continue;
                    }
                }

                TY_(UngetToken)( doc );

                /* Insert other content into noframes element. */
                if (frameset)
                {
                    if (noframes == NULL)
                    {
                        noframes = TY_(InferredTag)(doc, TidyTag_NOFRAMES);
                        TY_(InsertNodeAtEnd)(frameset, noframes);
                    }
                    else
                    {
                        TY_(Report)(doc, html, node, NOFRAMES_CONTENT);
                        if (noframes->type == StartEndTag)
                            noframes->type = StartTag;
                    }

                    TY_(ConstrainVersion)(doc, VERS_FRAMESET);
                    state = STATE_PARSE_NOFRAMES;
                    continue;
                }

                node = TY_(InferredTag)(doc, TidyTag_BODY);

                /* Issue #132 - disable inserting BODY tag warning
                 BUT only if NOT --show-body-only yes */
                if (!showingBodyOnly(doc))
                    TY_(Report)(doc, html, node, INSERTING_TAG );

                TY_(ConstrainVersion)(doc, ~VERS_FRAMESET);
                state = STATE_PARSE_BODY;
                continue;
            } break;


            /**************************************************************
             In this case, we're ready to parse the head, and move on to
             look for the body or body alternative.
             **************************************************************/
            case STATE_PARSE_HEAD:
            {
                TidyParserMemory memory = {0};
                memory.identity = TY_(ParseHTML);
                memory.mode = mode;
                memory.original_node = html;
                memory.reentry_node = node;
                memory.reentry_mode = mode;
                memory.reentry_state = STATE_PARSE_HEAD_REENTER;
                TY_(InsertNodeAtEnd)(html, node);
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return node;
            } break;

            case STATE_PARSE_HEAD_REENTER:
            {
                head = node;
                state = STATE_PRE_BODY;
            } break;


            /**************************************************************
             In this case, we can finally parse a body.
             **************************************************************/
            case STATE_PARSE_BODY:
            {
                TidyParserMemory memory = {0};
                memory.identity = NULL; /* we don't need to reenter */
                memory.mode = mode;
                memory.original_node = html;
                memory.reentry_node = NULL;
                memory.reentry_mode = mode;
                memory.reentry_state = STATE_COMPLETE;
                TY_(InsertNodeAtEnd)(html, node);
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return node;
            } break;


            /**************************************************************
             In this case, we will parse noframes. If necessary, the
             node is already inserted in the proper spot.
             **************************************************************/
            case STATE_PARSE_NOFRAMES:
            {
                TidyParserMemory memory = {0};
                memory.identity = TY_(ParseHTML);
                memory.mode = mode;
                memory.original_node = html;
                memory.reentry_node = frameset;
                memory.reentry_mode = mode;
                memory.reentry_state = STATE_PARSE_NOFRAMES_REENTER;
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return noframes;
            } break;

            case STATE_PARSE_NOFRAMES_REENTER:
            {
                frameset = node;
                state = STATE_PRE_BODY;
            } break;


            /**************************************************************
             In this case, we parse the frameset, and look for noframes
             content to merge later if necessary.
             **************************************************************/
            case STATE_PARSE_FRAMESET:
            {
                TidyParserMemory memory = {0};
                memory.identity = TY_(ParseHTML);
                memory.mode = mode;
                memory.original_node = html;
                memory.reentry_node = frameset;
                memory.reentry_mode = mode;
                memory.reentry_state = STATE_PARSE_FRAMESET_REENTER;
                TY_(InsertNodeAtEnd)(html, node);
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return node;
            } break;

            case (STATE_PARSE_FRAMESET_REENTER):
            {
                frameset = node;
                /*
                 See if it includes a noframes element so that
                 we can merge subsequent noframes elements.
                 */
                for (node = frameset->content; node; node = node->next)
                {
                    if ( nodeIsNOFRAMES(node) )
                        noframes = node;
                }
                state = STATE_PRE_BODY;
            } break;


            /**************************************************************
             We really shouldn't get here, but if we do, finish nicely.
             **************************************************************/
            default:
            {
                state = STATE_COMPLETE;
            }
        } /* switch */
    } /* while */

    DEBUG_LOG_EXIT;
    return NULL;
}